

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioVoice_SetChannelVolumes
                   (FAudioVoice *voice,uint32_t Channels,float *pVolumes,uint32_t OperationSet)

{
  uint sendIndex;
  
  if ((OperationSet == 0) || (voice->audio->active == '\0')) {
    if (pVolumes == (float *)0x0) {
      return 0x88960001;
    }
    if (voice->type == FAUDIO_VOICE_MASTER) {
      return 0x88960001;
    }
    if ((7 < voice->audio->version) && (voice->outputChannels != Channels)) {
      return 0x88960001;
    }
    FAudio_PlatformLockMutex(voice->sendLock);
    FAudio_PlatformLockMutex(voice->volumeLock);
    SDL_memcpy(voice->channelVolume,pVolumes,(ulong)Channels << 2);
    for (sendIndex = 0; sendIndex < (voice->sends).SendCount; sendIndex = sendIndex + 1) {
      FAudio_RecalcMixMatrix(voice,sendIndex);
    }
    FAudio_PlatformUnlockMutex(voice->volumeLock);
    FAudio_PlatformUnlockMutex(voice->sendLock);
  }
  else {
    FAudio_OPERATIONSET_QueueSetChannelVolumes(voice,Channels,pVolumes,OperationSet);
  }
  return 0;
}

Assistant:

uint32_t FAudioVoice_SetChannelVolumes(
	FAudioVoice *voice,
	uint32_t Channels,
	const float *pVolumes,
	uint32_t OperationSet
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	if (OperationSet != FAUDIO_COMMIT_NOW && voice->audio->active)
	{
		FAudio_OPERATIONSET_QueueSetChannelVolumes(
			voice,
			Channels,
			pVolumes,
			OperationSet
		);
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	if (pVolumes == NULL)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	if (voice->audio->version > 7 && Channels != voice->outputChannels)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	FAudio_memcpy(
		voice->channelVolume,
		pVolumes,
		sizeof(float) * Channels
	);

	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		FAudio_RecalcMixMatrix(voice, i);
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)

	LOG_API_EXIT(voice->audio)
	return 0;
}